

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O1

int cmac_test_wth_cipher
              (int verbose,char *testname,uchar *key,int keybits,uchar *messages,
              uint *message_lengths,uchar *expected_result,mbedtls_cipher_type_t cipher_type,
              int block_size,int num_tests)

{
  int iVar1;
  mbedtls_cipher_info_t *cipher_info;
  long lVar2;
  uchar output [16];
  uchar local_48 [24];
  
  cipher_info = mbedtls_cipher_info_from_type((mbedtls_cipher_type_t)expected_result);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    iVar1 = -0x6080;
  }
  else {
    lVar2 = 0;
    do {
      if (verbose != 0) {
        printf("  %s CMAC #%u: ",testname,(ulong)((int)lVar2 + 1));
      }
      iVar1 = mbedtls_cipher_cmac(cipher_info,key,(ulong)(uint)keybits,test_message,
                                  (ulong)*(uint *)(messages + lVar2 * 4),local_48);
      if ((iVar1 != 0) || (iVar1 = memcmp(local_48,message_lengths,(ulong)cipher_type), iVar1 != 0))
      {
        if (verbose == 0) {
          return iVar1;
        }
        puts("failed");
        return iVar1;
      }
      if (verbose != 0) {
        puts("passed");
      }
      lVar2 = lVar2 + 1;
      message_lengths = (uint *)((long)message_lengths + (long)(int)cipher_type);
    } while (lVar2 != 4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int cmac_test_wth_cipher( int verbose,
                                 const char* testname,
                                 const unsigned char* key,
                                 int keybits,
                                 const unsigned char* messages,
                                 const unsigned int message_lengths[4],
                                 const unsigned char* expected_result,
                                 mbedtls_cipher_type_t cipher_type,
                                 int block_size,
                                 int num_tests )
{
    const mbedtls_cipher_info_t *cipher_info;
    int i, ret = 0;
    unsigned char output[MBEDTLS_CIPHER_BLKSIZE_MAX];

    cipher_info = mbedtls_cipher_info_from_type( cipher_type );
    if( cipher_info == NULL )
    {
        /* Failing at this point must be due to a build issue */
        ret = MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE;
        goto exit;
    }

    for( i = 0; i < num_tests; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  %s CMAC #%u: ", testname, i + 1 );

        if( ( ret = mbedtls_cipher_cmac( cipher_info, key, keybits, messages,
                                         message_lengths[i], output ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );
            goto exit;
        }

        if( ( ret = memcmp( output, &expected_result[i * block_size], block_size ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
    ret = 0;

exit:
    return( ret );
}